

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmInstructionType
anon_unknown.dwarf_c91b1::GetLoadInstruction(ExpressionContext *ctx,TypeBase *type)

{
  bool bVar1;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  
  if ((type == ctx->typeBool) || (type == ctx->typeChar)) {
    ctx_local._4_4_ = VM_INST_LOAD_BYTE;
  }
  else if (type == ctx->typeShort) {
    ctx_local._4_4_ = VM_INST_LOAD_SHORT;
  }
  else if (type == ctx->typeInt) {
    ctx_local._4_4_ = VM_INST_LOAD_INT;
  }
  else if (type == ctx->typeFloat) {
    ctx_local._4_4_ = VM_INST_LOAD_FLOAT;
  }
  else if (type == ctx->typeDouble) {
    ctx_local._4_4_ = VM_INST_LOAD_DOUBLE;
  }
  else if (type == ctx->typeLong) {
    ctx_local._4_4_ = VM_INST_LOAD_LONG;
  }
  else {
    bVar1 = isType<TypeRef>(type);
    if (bVar1) {
      ctx_local._4_4_ = VM_INST_LOAD_LONG;
    }
    else {
      bVar1 = isType<TypeFunction>(type);
      if (bVar1) {
        ctx_local._4_4_ = VM_INST_LOAD_STRUCT;
      }
      else {
        bVar1 = isType<TypeUnsizedArray>(type);
        if (bVar1) {
          ctx_local._4_4_ = VM_INST_LOAD_STRUCT;
        }
        else if ((TypeStruct *)type == ctx->typeAutoRef) {
          ctx_local._4_4_ = VM_INST_LOAD_STRUCT;
        }
        else if ((TypeStruct *)type == ctx->typeAutoArray) {
          ctx_local._4_4_ = VM_INST_LOAD_STRUCT;
        }
        else {
          bVar1 = isType<TypeTypeID>(type);
          if (((!bVar1) && (bVar1 = isType<TypeFunctionID>(type), !bVar1)) &&
             (bVar1 = isType<TypeEnum>(type), !bVar1)) {
            bVar1 = isType<TypeNullptr>(type);
            if (bVar1) {
              return VM_INST_LOAD_LONG;
            }
            if (type->size == 0) {
              __assert_fail("type->size != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,400,
                            "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                           );
            }
            if (type->size % 4 != 0) {
              __assert_fail("type->size % 4 == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x191,
                            "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                           );
            }
            if (type->size < 0x10000000) {
              return VM_INST_LOAD_STRUCT;
            }
            __assert_fail("type->size < NULLC_MAX_TYPE_SIZE",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x192,
                          "VmInstructionType (anonymous namespace)::GetLoadInstruction(ExpressionContext &, TypeBase *)"
                         );
          }
          ctx_local._4_4_ = VM_INST_LOAD_INT;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

VmInstructionType GetLoadInstruction(ExpressionContext &ctx, TypeBase *type)
	{
		if(type == ctx.typeBool || type == ctx.typeChar)
			return VM_INST_LOAD_BYTE;

		if(type == ctx.typeShort)
			return VM_INST_LOAD_SHORT;

		if(type == ctx.typeInt)
			return VM_INST_LOAD_INT;

		if(type == ctx.typeFloat)
			return VM_INST_LOAD_FLOAT;

		if(type == ctx.typeDouble)
			return VM_INST_LOAD_DOUBLE;

		if(type == ctx.typeLong)
			return VM_INST_LOAD_LONG;

		if(isType<TypeRef>(type))
			return VM_INST_LOAD_POINTER;

		if(isType<TypeFunction>(type))
			return VM_INST_LOAD_STRUCT;

		if(isType<TypeUnsizedArray>(type))
			return VM_INST_LOAD_STRUCT;

		if(type == ctx.typeAutoRef)
			return VM_INST_LOAD_STRUCT;

		if(type == ctx.typeAutoArray)
			return VM_INST_LOAD_STRUCT;

		if(isType<TypeTypeID>(type) || isType<TypeFunctionID>(type) || isType<TypeEnum>(type))
			return VM_INST_LOAD_INT;

		if(isType<TypeNullptr>(type))
			return VM_INST_LOAD_POINTER;

		assert(type->size != 0);
		assert(type->size % 4 == 0);
		assert(type->size < NULLC_MAX_TYPE_SIZE);

		return VM_INST_LOAD_STRUCT;
	}